

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_request.hpp
# Opt level: O0

string_view __thiscall
cinatra::coro_http_request::get_header_value(coro_http_request *this,string_view key)

{
  string_view b;
  string_view a;
  string_view sVar1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  reference phVar5;
  http_parser *in_RDX;
  span<cinatra::http_header,_18446744073709551615UL> *in_RSI;
  http_header *header;
  iterator __end2;
  iterator __begin2;
  span<cinatra::http_header,_18446744073709551615UL> *__range2;
  span<cinatra::http_header,_18446744073709551615UL> headers;
  span<cinatra::http_header,_18446744073709551615UL> *in_stack_ffffffffffffff88;
  http_parser *in_stack_ffffffffffffff90;
  span<cinatra::http_header,_18446744073709551615UL> *in_stack_ffffffffffffff98;
  span<cinatra::http_header,_18446744073709551615UL> *psVar6;
  span<cinatra::http_header,_18446744073709551615UL> local_38;
  span<cinatra::http_header,_18446744073709551615UL> *local_20;
  http_parser *local_18;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_20 = in_RSI;
  local_18 = in_RDX;
  local_38 = http_parser::get_headers(in_stack_ffffffffffffff90);
  psVar6 = &local_38;
  iVar3 = std::span<cinatra::http_header,_18446744073709551615UL>::begin(in_stack_ffffffffffffff88);
  iVar4 = std::span<cinatra::http_header,_18446744073709551615UL>::end(in_stack_ffffffffffffff98);
  do {
    bVar2 = __gnu_cxx::
            operator==<cinatra::http_header_*,_std::span<cinatra::http_header,_18446744073709551615UL>_>
                      ((__normal_iterator<cinatra::http_header_*,_std::span<cinatra::http_header,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<cinatra::http_header_*,_std::span<cinatra::http_header,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff88);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_10);
LAB_0018e9b7:
      sVar1._M_str = local_10._M_str;
      sVar1._M_len = local_10._M_len;
      return sVar1;
    }
    phVar5 = __gnu_cxx::
             __normal_iterator<cinatra::http_header_*,_std::span<cinatra::http_header,_18446744073709551615UL>_>
             ::operator*((__normal_iterator<cinatra::http_header_*,_std::span<cinatra::http_header,_18446744073709551615UL>_>
                          *)&stack0xffffffffffffffb8);
    a._M_str = (char *)psVar6;
    a._M_len = (size_t)iVar3._M_current;
    b._M_str = (char *)iVar4._M_current;
    b._M_len = (size_t)phVar5;
    in_stack_ffffffffffffff88 = local_20;
    in_stack_ffffffffffffff90 = local_18;
    bVar2 = iequal0(a,b);
    if (bVar2) {
      local_10._M_len = (phVar5->value)._M_len;
      local_10._M_str = (phVar5->value)._M_str;
      goto LAB_0018e9b7;
    }
    __gnu_cxx::
    __normal_iterator<cinatra::http_header_*,_std::span<cinatra::http_header,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<cinatra::http_header_*,_std::span<cinatra::http_header,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffb8);
  } while( true );
}

Assistant:

std::string_view get_header_value(std::string_view key) {
    auto headers = parser_.get_headers();
    for (auto &header : headers) {
      if (iequal0(header.name, key)) {
        return header.value;
      }
    }

    return {};
  }